

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void google::protobuf::internal::PackedFieldHelper<2>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  undefined4 uVar1;
  undefined8 in_RAX;
  uint8 *ptr;
  RepeatedField<float> *array;
  long lVar2;
  uint32 local_28;
  undefined4 local_24;
  
  if (*field != 0) {
    _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),md->tag);
    PrimitiveTypeHelper<13>::Serialize(&local_28,output);
    _local_28 = CONCAT44(*(undefined4 *)((long)field + 0x10),local_28);
    PrimitiveTypeHelper<13>::Serialize(&local_24,output);
    if (0 < *field) {
      ptr = output->cur_;
      lVar2 = 0;
      do {
        uVar1 = *(undefined4 *)(*(long *)((long)field + 8) + lVar2 * 4);
        if ((output->impl_).end_ <= ptr) {
          ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr);
        }
        *(undefined4 *)ptr = uVar1;
        ptr = ptr + 4;
        output->cur_ = ptr;
        lVar2 = lVar2 + 1;
      } while (lVar2 < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}